

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

small_vector<long,_4UL,_0UL,_std::allocator<long>_> * __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::operator=
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,
          small_vector<long,_4UL,_0UL,_std::allocator<long>_> *v)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  size_t sVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    plVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 3);
    this->m_end = plVar2;
    this->m_begin = plVar2;
    plVar3 = v->m_begin;
    plVar1 = plVar2;
    if (plVar3 != v->m_end) {
      do {
        *plVar1 = *plVar3;
        this->m_end = plVar1 + 1;
        plVar3 = plVar3 + 1;
        plVar1 = plVar1 + 1;
      } while (plVar3 != v->m_end);
    }
    sVar4 = 4;
    if ((type *)plVar2 != this->m_static_data) {
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }